

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint16_t ucnv_countAliases_63(char *alias,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  UErrorCode *pErrorCode_local;
  char *alias_local;
  
  uVar1 = ucnv_io_countAliases(alias,pErrorCode);
  return uVar1;
}

Assistant:

U_CAPI uint16_t U_EXPORT2
ucnv_countAliases(const char *alias, UErrorCode *pErrorCode)
{
    return ucnv_io_countAliases(alias, pErrorCode);
}